

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

void lodepng_info_cleanup(LodePNGInfo *info)

{
  lodepng_palette_clear(&info->color);
  LodePNGText_cleanup(info);
  LodePNGIText_cleanup(info);
  LodePNGUnknownChunks_cleanup(info);
  return;
}

Assistant:

void lodepng_info_cleanup(LodePNGInfo* info)
{
	lodepng_color_mode_cleanup(&info->color);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
	LodePNGText_cleanup(info);
	LodePNGIText_cleanup(info);

	LodePNGUnknownChunks_cleanup(info);
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
}